

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int checkTreePage(IntegrityCk *pCheck,int iPage,i64 *piMinKey,i64 maxKey)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  BtShared *pBt;
  char *pcVar5;
  int iVar6;
  int iVar7;
  u8 *puVar8;
  ushort uVar9;
  u16 uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ushort *puVar20;
  ulong uVar21;
  uint *puVar22;
  uint *puVar23;
  MemPage *pMVar24;
  uint uVar25;
  int iVar26;
  bool bVar27;
  MemPage *pPage;
  CellInfo info;
  i64 local_c8;
  int local_bc;
  u8 *local_b8;
  BtShared *local_b0;
  ulong local_a8;
  MemPage *local_a0;
  uint local_94;
  int local_90;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  u8 *local_68;
  uint *local_60;
  ulong local_58;
  i64 *local_50;
  CellInfo local_48;
  
  local_a0 = (MemPage *)0x0;
  if (iPage == 0) {
    return 0;
  }
  pBt = pCheck->pBt;
  pcVar5 = pCheck->zPfx;
  iVar6 = pCheck->v1;
  iVar7 = pCheck->v2;
  uVar12 = pBt->usableSize;
  local_c8 = maxKey;
  local_50 = piMinKey;
  iVar11 = checkRef(pCheck,iPage);
  if (iVar11 != 0) {
    return 0;
  }
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  local_a8 = (ulong)uVar12;
  uVar12 = btreeGetPage(pBt,iPage,&local_a0,0);
  pMVar24 = local_a0;
  if (uVar12 == 0) {
    uVar1 = local_a0->isInit;
    local_a0->isInit = '\0';
    local_b0 = pBt;
    uVar12 = btreeInitPage(local_a0);
    if (uVar12 == 0) {
      local_b8 = pMVar24->aData;
      local_80 = (ulong)pMVar24->hdrOffset;
      pCheck->zPfx = "On tree page %d cell %d: ";
      bVar2 = local_b8[local_80 + 5];
      bVar3 = local_b8[local_80 + 6];
      local_70 = (ulong)local_b8[local_80 + 3] << 8;
      local_88 = (ulong)local_b8[local_80 + 4];
      local_78 = (ulong)((int)local_70 + (uint)local_b8[local_80 + 4]);
      lVar19 = local_80 - (uint)pMVar24->leaf * 4;
      if (pMVar24->leaf == 0) {
        uVar12 = *(uint *)(local_b8 + local_80 + 8);
        uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
        ;
        if (local_b0->autoVacuum != '\0') {
          pCheck->zPfx = "On page %d at right child: ";
          checkPtrmap(pCheck,uVar12,'\x05',iPage);
        }
        iVar11 = checkTreePage(pCheck,uVar12,&local_c8,maxKey);
        puVar23 = (uint *)0x0;
        bVar27 = false;
      }
      else {
        puVar23 = pCheck->heap;
        *puVar23 = 0;
        iVar11 = -1;
        bVar27 = true;
      }
      local_68 = (u8 *)(lVar19 + 0xc);
      uVar12 = ((uint)bVar2 * 0x100 + (uint)bVar3) - 1 & 0xffff;
      local_58 = (ulong)uVar12;
      if ((int)local_78 == 0) {
        *local_50 = local_c8;
        pCheck->zPfx = (char *)0x0;
      }
      else {
        local_8c = uVar12 + 1;
        puVar20 = (ushort *)(local_b8 + ((int)lVar19 + 10 + (int)local_78 * 2));
        iVar26 = (int)local_70 + (int)local_88;
        uVar12 = (int)local_a8 - 4;
        local_90 = (int)local_a8 + -5;
        local_bc = 1;
        do {
          iVar26 = iVar26 + -1;
          if (pCheck->mxErr == 0) break;
          pCheck->v2 = iVar26;
          uVar9 = *puVar20 << 8 | *puVar20 >> 8;
          uVar25 = (uint)uVar9;
          if (uVar12 < uVar25 || uVar9 <= (uint)local_58) {
            local_bc = 0;
            checkAppendMsg(pCheck,"Offset %d out of range %d..%d",(ulong)uVar9,(ulong)local_8c,
                           (ulong)uVar12);
          }
          else {
            local_60 = (uint *)(local_b8 + uVar25);
            (*pMVar24->xParseCell)(pMVar24,(u8 *)local_60,&local_48);
            if ((uint)local_a8 < local_48.nSize + uVar25) {
              local_bc = 0;
              checkAppendMsg(pCheck,"Extends off end of page");
            }
            else {
              if (pMVar24->intKey != '\0') {
                if (bVar27) {
                  if (local_c8 < local_48.nKey) {
LAB_0014620a:
                    checkAppendMsg(pCheck,"Rowid %lld out of order");
                  }
                }
                else if (local_c8 <= local_48.nKey) goto LAB_0014620a;
                bVar27 = false;
                local_c8 = local_48.nKey;
              }
              if (local_48.nLocal < local_48.nPayload) {
                iVar13 = local_48.nPayload + local_90;
                uVar17 = (uint)local_48.nLocal;
                uVar14 = *(uint *)((long)local_60 + ((ulong)local_48.nSize - 4));
                uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                         uVar14 << 0x18;
                if (local_b0->autoVacuum != '\0') {
                  local_94 = uVar14;
                  checkPtrmap(pCheck,uVar14,'\x03',iPage);
                  uVar14 = local_94;
                }
                checkList(pCheck,0,uVar14,(iVar13 - uVar17) / uVar12);
              }
              if (pMVar24->leaf == '\0') {
                uVar25 = *local_60;
                uVar25 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 |
                         uVar25 << 0x18;
                if (local_b0->autoVacuum != '\0') {
                  checkPtrmap(pCheck,uVar25,'\x05',iPage);
                }
                iVar13 = checkTreePage(pCheck,uVar25,&local_c8,local_c8);
                if (iVar13 != iVar11) {
                  checkAppendMsg(pCheck,"Child page depth differs");
                  iVar11 = iVar13;
                }
                bVar27 = false;
              }
              else {
                uVar14 = *puVar23 + 1;
                *puVar23 = uVar14;
                puVar23[uVar14] = ((uint)uVar9 + (uint)local_48.nSize) - 1 | uVar25 << 0x10;
                uVar15 = (ulong)uVar14;
                if (1 < uVar14) {
                  do {
                    uVar16 = uVar15 >> 1;
                    uVar25 = puVar23[uVar16];
                    if (uVar25 <= puVar23[uVar15]) break;
                    puVar23[uVar16] = puVar23[uVar15];
                    puVar23[uVar15] = uVar25;
                    uVar25 = (uint)uVar15;
                    uVar15 = uVar16;
                  } while (3 < uVar25);
                }
              }
            }
          }
          puVar20 = puVar20 + -1;
        } while (0 < iVar26);
        *local_50 = local_c8;
        pCheck->zPfx = (char *)0x0;
        if (local_bc == 0) {
          pMVar24->isInit = uVar1;
          goto LAB_00145f77;
        }
      }
      puVar8 = local_b8;
      if (0 < pCheck->mxErr) {
        if (pMVar24->leaf == '\0') {
          puVar23 = pCheck->heap;
          *puVar23 = 0;
          if ((int)local_78 != 0) {
            local_68 = local_68 + (long)local_b8;
            uVar15 = (ulong)((uint)local_70 | (uint)local_88);
            do {
              uVar9 = *(ushort *)(local_68 + uVar15 * 2 + -2) << 8 |
                      *(ushort *)(local_68 + uVar15 * 2 + -2) >> 8;
              uVar10 = (*pMVar24->xCellSize)(pMVar24,puVar8 + uVar9);
              uVar12 = *puVar23 + 1;
              *puVar23 = uVar12;
              puVar23[uVar12] = ((uint)uVar9 + (uint)uVar10) - 1 | (uint)uVar9 << 0x10;
              uVar16 = (ulong)uVar12;
              if (1 < uVar12) {
                do {
                  uVar21 = uVar16 >> 1;
                  uVar12 = puVar23[uVar21];
                  if (uVar12 <= puVar23[uVar16]) break;
                  puVar23[uVar21] = puVar23[uVar16];
                  puVar23[uVar16] = uVar12;
                  uVar12 = (uint)uVar16;
                  uVar16 = uVar21;
                } while (3 < uVar12);
              }
              bVar27 = 1 < (long)uVar15;
              uVar15 = uVar15 - 1;
            } while (bVar27);
          }
        }
        for (uVar9 = *(ushort *)(puVar8 + local_80 + 1) << 8 |
                     *(ushort *)(puVar8 + local_80 + 1) >> 8; uVar9 != 0;
            uVar9 = *(ushort *)(puVar8 + uVar9) << 8 | *(ushort *)(puVar8 + uVar9) >> 8) {
          uVar4 = *(ushort *)(puVar8 + (ulong)uVar9 + 2);
          uVar12 = *puVar23 + 1;
          *puVar23 = uVar12;
          puVar23[uVar12] =
               ((uint)(ushort)(uVar4 << 8 | uVar4 >> 8) + (uint)uVar9) - 1 | (uint)uVar9 << 0x10;
          uVar15 = (ulong)uVar12;
          if (1 < uVar12) {
            do {
              uVar16 = uVar15 >> 1;
              uVar12 = puVar23[uVar16];
              if (uVar12 <= puVar23[uVar15]) break;
              puVar23[uVar16] = puVar23[uVar15];
              puVar23[uVar15] = uVar12;
              uVar12 = (uint)uVar15;
              uVar15 = uVar16;
            } while (3 < uVar12);
          }
        }
        uVar12 = *puVar23;
        iVar26 = 0;
        uVar25 = (uint)local_58;
        if (uVar12 != 0) {
          uVar15 = local_58 & 0xffffffff;
          do {
            uVar25 = puVar23[1];
            puVar23[1] = puVar23[uVar12];
            puVar23[uVar12] = 0xffffffff;
            uVar14 = uVar12 - 1;
            *puVar23 = uVar14;
            bVar27 = 2 < uVar12;
            uVar12 = uVar14;
            if (bVar27) {
              uVar14 = puVar23[1];
              uVar16 = (ulong)((puVar23[3] < puVar23[2]) + 2);
              uVar17 = puVar23[uVar16];
              if (uVar17 <= uVar14) {
                puVar22 = puVar23 + uVar16;
                uVar21 = 1;
                do {
                  uVar18 = uVar16;
                  puVar23[uVar21] = uVar17;
                  *puVar22 = uVar14;
                  uVar17 = (int)uVar18 * 2;
                  uVar12 = *puVar23;
                  if (uVar12 < uVar17) break;
                  uVar16 = (ulong)(uVar17 | 1);
                  if (puVar23[uVar17] <= puVar23[uVar16]) {
                    uVar16 = (ulong)uVar17;
                  }
                  puVar22 = puVar23 + uVar16;
                  uVar17 = *puVar22;
                  uVar21 = uVar18;
                } while (uVar17 <= uVar14);
              }
            }
            uVar17 = (uint)uVar15 & 0xffff;
            uVar14 = uVar25 >> 0x10;
            if (uVar14 <= uVar17) {
              checkAppendMsg(pCheck,"Multiple uses for byte %u of page %d",uVar14,(ulong)(uint)iPage
                            );
              uVar25 = (uint)uVar15;
              if (*puVar23 != 0) goto LAB_00145f31;
              break;
            }
            iVar26 = iVar26 + ~uVar17 + uVar14;
            uVar15 = (ulong)uVar25;
          } while (uVar12 != 0);
        }
        uVar12 = (int)local_a8 + (~uVar25 | 0xffff0000) + iVar26;
        if (uVar12 != local_b8[local_80 + 7]) {
          checkAppendMsg(pCheck,"Fragmentation of %d bytes reported as %d on page %d",(ulong)uVar12,
                         (ulong)local_b8[local_80 + 7],(ulong)(uint)iPage);
        }
      }
      goto LAB_00145f31;
    }
    checkAppendMsg(pCheck,"btreeInitPage() returns error code %d",(ulong)uVar12);
    iVar11 = -1;
  }
  else {
    checkAppendMsg(pCheck,"unable to get the page. error code=%d",(ulong)uVar12);
    iVar11 = -1;
    pMVar24 = local_a0;
LAB_00145f31:
    if (pMVar24 == (MemPage *)0x0) goto LAB_00145f85;
  }
LAB_00145f77:
  sqlite3PagerUnrefNotNull(pMVar24->pDbPage);
LAB_00145f85:
  pCheck->zPfx = pcVar5;
  pCheck->v1 = iVar6;
  pCheck->v2 = iVar7;
  return iVar11 + 1;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  i64 *piMinKey,        /* Write minimum integer primary key here */
  i64 maxKey            /* Error if integer primary key greater than this */
){
  MemPage *pPage = 0;      /* The page being analyzed */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subroutine call */
  int depth = -1, d2;      /* Depth of a subtree */
  int pgno;                /* Page number */
  int nFrag;               /* Number of fragmented bytes on the page */
  int hdr;                 /* Offset to the page header */
  int cellStart;           /* Offset to the start of the cell pointer array */
  int nCell;               /* Number of cells */
  int doCoverageCheck = 1; /* True if cell coverage checking should be done */
  int keyCanBeEqual = 1;   /* True if IPK can be equal to maxKey
                           ** False if IPK must be strictly less than maxKey */
  u8 *data;                /* Page content */
  u8 *pCell;               /* Cell content */
  u8 *pCellIdx;            /* Next element of the cell pointer array */
  BtShared *pBt;           /* The BtShared object that owns pPage */
  u32 pc;                  /* Address of a cell */
  u32 usableSize;          /* Usable size of the page */
  u32 contentOffset;       /* Offset to the start of the cell content area */
  u32 *heap = 0;           /* Min-heap used for checking cell coverage */
  u32 x, prev = 0;         /* Next and previous entry on the min-heap */
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;
  u8 savedIsInit = 0;

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  savedIsInit = pPage->isInit;
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    goto end_of_check;
  }
  data = pPage->aData;
  hdr = pPage->hdrOffset;

  /* Set up for cell analysis */
  pCheck->zPfx = "On tree page %d cell %d: ";
  contentOffset = get2byteNotZero(&data[hdr+5]);
  assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */

  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  nCell = get2byte(&data[hdr+3]);
  assert( pPage->nCell==nCell );

  /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
  ** immediately follows the b-tree page header. */
  cellStart = hdr + 12 - 4*pPage->leaf;
  assert( pPage->aCellIdx==&data[cellStart] );
  pCellIdx = &data[cellStart + 2*(nCell-1)];

  if( !pPage->leaf ){
    /* Analyze the right-child page of internal pages */
    pgno = get4byte(&data[hdr+8]);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      pCheck->zPfx = "On page %d at right child: ";
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    depth = checkTreePage(pCheck, pgno, &maxKey, maxKey);
    keyCanBeEqual = 0;
  }else{
    /* For leaf pages, the coverage check will occur in the same loop
    ** as the other cell checks, so initialize the heap.  */
    heap = pCheck->heap;
    heap[0] = 0;
  }

  /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
  ** integer offsets to the cell contents. */
  for(i=nCell-1; i>=0 && pCheck->mxErr; i--){
    CellInfo info;

    /* Check cell size */
    pCheck->v2 = i;
    assert( pCellIdx==&data[cellStart + i*2] );
    pc = get2byteAligned(pCellIdx);
    pCellIdx -= 2;
    if( pc<contentOffset || pc>usableSize-4 ){
      checkAppendMsg(pCheck, "Offset %d out of range %d..%d",
                             pc, contentOffset, usableSize-4);
      doCoverageCheck = 0;
      continue;
    }
    pCell = &data[pc];
    pPage->xParseCell(pPage, pCell, &info);
    if( pc+info.nSize>usableSize ){
      checkAppendMsg(pCheck, "Extends off end of page");
      doCoverageCheck = 0;
      continue;
    }

    /* Check for integer primary key out of range */
    if( pPage->intKey ){
      if( keyCanBeEqual ? (info.nKey > maxKey) : (info.nKey >= maxKey) ){
        checkAppendMsg(pCheck, "Rowid %lld out of order", info.nKey);
      }
      maxKey = info.nKey;
      keyCanBeEqual = 0;     /* Only the first key on the page may ==maxKey */
    }

    /* Check the content overflow list */
    if( info.nPayload>info.nLocal ){
      int nPage;       /* Number of pages on the overflow chain */
      Pgno pgnoOvfl;   /* First page of the overflow chain */
      assert( pc + info.nSize - 4 <= usableSize );
      nPage = (info.nPayload - info.nLocal + usableSize - 5)/(usableSize - 4);
      pgnoOvfl = get4byte(&pCell[info.nSize - 4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    if( !pPage->leaf ){
      /* Check sanity of left child page for internal pages */
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &maxKey, maxKey);
      keyCanBeEqual = 0;
      if( d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
        depth = d2;
      }
    }else{
      /* Populate the coverage-checking heap for leaf pages */
      btreeHeapInsert(heap, (pc<<16)|(pc+info.nSize-1));
    }
  }
  *piMinKey = maxKey;

  /* Check for complete coverage of the page
  */
  pCheck->zPfx = 0;
  if( doCoverageCheck && pCheck->mxErr>0 ){
    /* For leaf pages, the min-heap has already been initialized and the
    ** cells have already been inserted.  But for internal pages, that has
    ** not yet been done, so do it now */
    if( !pPage->leaf ){
      heap = pCheck->heap;
      heap[0] = 0;
      for(i=nCell-1; i>=0; i--){
        u32 size;
        pc = get2byteAligned(&data[cellStart+i*2]);
        size = pPage->xCellSize(pPage, &data[pc]);
        btreeHeapInsert(heap, (pc<<16)|(pc+size-1));
      }
    }
    /* Add the freeblocks to the min-heap
    **
    ** EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page. 
    */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( (u32)i<=usableSize-4 );     /* Enforced by btreeInitPage() */
      size = get2byte(&data[i+2]);
      assert( (u32)(i+size)<=usableSize );  /* Enforced by btreeInitPage() */
      btreeHeapInsert(heap, (((u32)i)<<16)|(i+size-1));
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );  /* Enforced by btreeInitPage() */
      assert( (u32)j<=usableSize-4 );   /* Enforced by btreeInitPage() */
      i = j;
    }
    /* Analyze the min-heap looking for overlap between cells and/or 
    ** freeblocks, and counting the number of untracked bytes in nFrag.
    ** 
    ** Each min-heap entry is of the form:    (start_address<<16)|end_address.
    ** There is an implied first entry the covers the page header, the cell
    ** pointer index, and the gap between the cell pointer index and the start
    ** of cell content.  
    **
    ** The loop below pulls entries from the min-heap in order and compares
    ** the start_address against the previous end_address.  If there is an
    ** overlap, that means bytes are used multiple times.  If there is a gap,
    ** that gap is added to the fragmentation count.
    */
    nFrag = 0;
    prev = contentOffset - 1;   /* Implied first min-heap entry */
    while( btreeHeapPull(heap,&x) ){
      if( (prev&0xffff)>=(x>>16) ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %u of page %d", x>>16, iPage);
        break;
      }else{
        nFrag += (x>>16) - (prev&0xffff) - 1;
        prev = x;
      }
    }
    nFrag += usableSize - (prev&0xffff) - 1;
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( heap[0]==0 && nFrag!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %d bytes reported as %d on page %d",
          nFrag, data[hdr+7], iPage);
    }
  }

end_of_check:
  if( !doCoverageCheck ) pPage->isInit = savedIsInit;
  releasePage(pPage);
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}